

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseSubscriptWithBrackets(StructuralParser *this,Expression *lhs)

{
  bool bVar1;
  Constant *pCVar2;
  Expression *pEVar3;
  Context context;
  pool_ptr<soul::AST::Expression> local_98;
  Context local_90;
  pool_ptr<soul::AST::Expression> local_78;
  pool_ptr<soul::AST::Expression> local_70;
  pool_ptr<soul::AST::Expression> local_68;
  pool_ptr<soul::AST::Expression> local_60;
  Value local_58;
  
  getContext(&local_90,this);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275274);
  if (bVar1) {
    soul::Value::createArrayIndex<int>(&local_58,0);
    pCVar2 = allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>(this,&local_90,&local_58)
    ;
    soul::Value::~Value(&local_58);
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x29aa2b);
    if (bVar1) {
      local_68.object = (Expression *)0x0;
    }
    else {
      local_68.object = parseExpression(this,false);
    }
    local_60.object = &pCVar2->super_Expression;
    local_98.object = checkAndCreateArrayElementRef(this,&local_90,lhs,&local_60,&local_68);
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x29aa2b);
    if (bVar1) {
      local_58.type.category = invalid;
      local_58.type.arrayElementCategory = invalid;
      local_58.type.isRef = false;
      local_58.type.isConstant = false;
      local_58.type.primitiveType.type = invalid;
      local_98.object =
           &allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,decltype(nullptr)>
                      (this,&local_90,lhs,(void **)&local_58)->super_Expression;
    }
    else {
      pEVar3 = parseExpression(this,false);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275274);
      if (bVar1) {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x29aa2b);
        if (bVar1) {
          local_78.object = (Expression *)0x0;
        }
        else {
          local_78.object = parseExpression(this,false);
        }
        local_70.object = pEVar3;
        local_98.object = checkAndCreateArrayElementRef(this,&local_90,lhs,&local_70,&local_78);
      }
      else {
        local_98.object =
             &allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                        (this,&local_90,lhs,pEVar3)->super_Expression;
      }
    }
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchAndReplaceIf<soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x275af2,(TokenType)0x29aa2b);
  if (!bVar1) {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29aa2b);
  }
  pEVar3 = pool_ptr<soul::AST::Expression>::operator*(&local_98);
  pEVar3 = parseSuffixes(this,pEVar3);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_90);
  return pEVar3;
}

Assistant:

AST::Expression& parseSubscriptWithBrackets (AST::Expression& lhs)
    {
        auto context = getContext();
        pool_ptr<AST::Expression> e, end;

        if (matchIf (Operator::colon))
        {
            auto& start = allocate<AST::Constant> (context, Value::createArrayIndex (0));

            if (! matches (Operator::closeBracket))
                end = parseExpression();

            e = checkAndCreateArrayElementRef (context, lhs, start, end);
        }
        else if (matches (Operator::closeBracket))
        {
            e = allocate<AST::SubscriptWithBrackets> (context, lhs, nullptr);
        }
        else
        {
            auto& start = parseExpression();

            if (matchIf (Operator::colon))
            {
                if (! matches (Operator::closeBracket))
                    end = parseExpression();

                e = checkAndCreateArrayElementRef (context, lhs, start, end);
            }
            else
            {
                e = allocate<AST::SubscriptWithBrackets> (context, lhs, start);
            }
        }

        if (matchAndReplaceIf (Operator::closeDoubleBracket, Operator::closeBracket))
            return parseSuffixes (*e);

        expect (Operator::closeBracket);
        return parseSuffixes (*e);
    }